

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int fmt::v9::detail::code_point_length<char>(char *begin)

{
  int iVar1;
  char *in_RDI;
  int len;
  
  iVar1 = code_point_length_impl(*in_RDI);
  return iVar1 + (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

FMT_CONSTEXPR auto code_point_length(const Char* begin) -> int {
  if (const_check(sizeof(Char) != 1)) return 1;
  int len = code_point_length_impl(static_cast<char>(*begin));

  // Compute the pointer to the next character early so that the next
  // iteration can start working on the next character. Neither Clang
  // nor GCC figure out this reordering on their own.
  return len + !len;
}